

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeConstraint::copyFrom(ShapeConstraint *this,ShapeConstraint *other)

{
  ShapeRange *pSVar1;
  ShapeRange local_b8;
  ShapeRange local_98;
  ShapeRange local_78;
  ShapeRange local_58;
  ShapeRange local_38;
  ShapeConstraint *local_18;
  ShapeConstraint *other_local;
  ShapeConstraint *this_local;
  
  local_18 = other;
  other_local = this;
  pSVar1 = sequenceRange(other);
  ShapeRange::intersect(&local_38,&this->_sequenceRange,pSVar1);
  (this->_sequenceRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_sequenceRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_sequenceRange)._minimum._val = local_38._minimum._val;
  (this->_sequenceRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_sequenceRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_sequenceRange)._maximum._val = local_38._maximum._val;
  pSVar1 = batchRange(local_18);
  ShapeRange::intersect(&local_58,&this->_batchRange,pSVar1);
  (this->_batchRange)._minimum._isUnbound = local_58._minimum._isUnbound;
  *(undefined7 *)&(this->_batchRange)._minimum.field_0x1 = local_58._minimum._1_7_;
  (this->_batchRange)._minimum._val = local_58._minimum._val;
  (this->_batchRange)._maximum._isUnbound = local_58._maximum._isUnbound;
  *(undefined7 *)&(this->_batchRange)._maximum.field_0x1 = local_58._maximum._1_7_;
  (this->_batchRange)._maximum._val = local_58._maximum._val;
  pSVar1 = channelRange(local_18);
  ShapeRange::intersect(&local_78,&this->_channelRange,pSVar1);
  (this->_channelRange)._minimum._isUnbound = local_78._minimum._isUnbound;
  *(undefined7 *)&(this->_channelRange)._minimum.field_0x1 = local_78._minimum._1_7_;
  (this->_channelRange)._minimum._val = local_78._minimum._val;
  (this->_channelRange)._maximum._isUnbound = local_78._maximum._isUnbound;
  *(undefined7 *)&(this->_channelRange)._maximum.field_0x1 = local_78._maximum._1_7_;
  (this->_channelRange)._maximum._val = local_78._maximum._val;
  pSVar1 = heightRange(local_18);
  ShapeRange::intersect(&local_98,&this->_heightRange,pSVar1);
  (this->_heightRange)._minimum._isUnbound = local_98._minimum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._minimum.field_0x1 = local_98._minimum._1_7_;
  (this->_heightRange)._minimum._val = local_98._minimum._val;
  (this->_heightRange)._maximum._isUnbound = local_98._maximum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._maximum.field_0x1 = local_98._maximum._1_7_;
  (this->_heightRange)._maximum._val = local_98._maximum._val;
  pSVar1 = widthRange(local_18);
  ShapeRange::intersect(&local_b8,&this->_widthRange,pSVar1);
  (this->_widthRange)._minimum._isUnbound = local_b8._minimum._isUnbound;
  *(undefined7 *)&(this->_widthRange)._minimum.field_0x1 = local_b8._minimum._1_7_;
  (this->_widthRange)._minimum._val = local_b8._minimum._val;
  (this->_widthRange)._maximum._isUnbound = local_b8._maximum._isUnbound;
  *(undefined7 *)&(this->_widthRange)._maximum.field_0x1 = local_b8._maximum._1_7_;
  (this->_widthRange)._maximum._val = local_b8._maximum._val;
  return;
}

Assistant:

void ShapeConstraint::copyFrom(const ShapeConstraint& other) {
    _sequenceRange = _sequenceRange.intersect(other.sequenceRange());
    _batchRange = _batchRange.intersect(other.batchRange());
    _channelRange = _channelRange.intersect(other.channelRange());
    _heightRange = _heightRange.intersect(other.heightRange());
    _widthRange = _widthRange.intersect(other.widthRange());
}